

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ClockingBlockSymbol::ClockingBlockSymbol
          (ClockingBlockSymbol *this,Compilation *compilation,string_view name,SourceLocation loc)

{
  Compilation *compilation_local;
  ClockingBlockSymbol *this_local;
  SourceLocation loc_local;
  string_view name_local;
  
  Symbol::Symbol(&this->super_Symbol,ClockingBlock,name,loc);
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  this->event = (TimingControl *)0x0;
  std::optional<slang::ast::ClockingSkew>::optional(&this->defaultInputSkew);
  std::optional<slang::ast::ClockingSkew>::optional(&this->defaultOutputSkew);
  this->inputSkewSyntax = (ClockingSkewSyntax *)0x0;
  this->outputSkewSyntax = (ClockingSkewSyntax *)0x0;
  return;
}

Assistant:

ClockingBlockSymbol::ClockingBlockSymbol(Compilation& compilation, string_view name,
                                         SourceLocation loc) :
    Symbol(SymbolKind::ClockingBlock, name, loc),
    Scope(compilation, this) {
}